

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIListBox::~CGUIListBox(CGUIListBox *this)

{
  CGUIListBox *in_RDI;
  
  ~CGUIListBox(in_RDI);
  operator_delete(in_RDI,0x1d0);
  return;
}

Assistant:

CGUIListBox::~CGUIListBox()
{
	if (ScrollBar)
		ScrollBar->drop();

	if (Font)
		Font->drop();

	if (IconBank)
		IconBank->drop();
}